

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O3

UBool __thiscall
icu_63::FCDUTF16CollationIterator::normalize
          (FCDUTF16CollationIterator *this,UChar *from,UChar *to,UErrorCode *errorCode)

{
  ushort uVar1;
  UBool UVar2;
  int iVar3;
  char16_t *pcVar4;
  
  Normalizer2Impl::decompose
            (this->nfcImpl,from,to,&this->normalized,(int32_t)((ulong)((long)to - (long)from) >> 1),
             errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this->segmentStart = from;
    this->segmentLimit = to;
    uVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar4 = (this->normalized).fUnion.fFields.fArray;
      }
      else {
        pcVar4 = (this->normalized).fUnion.fStackFields.fBuffer;
      }
    }
    else {
      pcVar4 = (char16_t *)0x0;
    }
    (this->super_UTF16CollationIterator).start = pcVar4;
    if ((short)uVar1 < 0) {
      iVar3 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)(short)uVar1 >> 5;
    }
    (this->super_UTF16CollationIterator).limit = pcVar4 + iVar3;
    UVar2 = '\x01';
  }
  else {
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool
FCDUTF16CollationIterator::normalize(const UChar *from, const UChar *to, UErrorCode &errorCode) {
    // NFD without argument checking.
    U_ASSERT(U_SUCCESS(errorCode));
    nfcImpl.decompose(from, to, normalized, (int32_t)(to - from), errorCode);
    if(U_FAILURE(errorCode)) { return FALSE; }
    // Switch collation processing into the FCD buffer
    // with the result of normalizing [segmentStart, segmentLimit[.
    segmentStart = from;
    segmentLimit = to;
    start = normalized.getBuffer();
    limit = start + normalized.length();
    return TRUE;
}